

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

void __thiscall Cleaner::PrintHeader(Cleaner *this)

{
  Verbosity VVar1;
  int __c;
  
  if (this->config_->verbosity == QUIET) {
    return;
  }
  printf("Cleaning...");
  VVar1 = this->config_->verbosity;
  if ((VVar1 == QUIET) || ((__c = 10, VVar1 != VERBOSE && (this->config_->dry_run == false)))) {
    __c = 0x20;
  }
  putchar(__c);
  fflush(_stdout);
  return;
}

Assistant:

void Cleaner::PrintHeader() {
  if (config_.verbosity == BuildConfig::QUIET)
    return;
  printf("Cleaning...");
  if (IsVerbose())
    printf("\n");
  else
    printf(" ");
  fflush(stdout);
}